

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

int SDL_CDPlay(SDL12_CD *cdrom,int start,int length)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  int ntracks;
  long lVar4;
  uint uVar5;
  uint start_track;
  undefined4 in_register_00000034;
  long lVar6;
  char *pcVar7;
  Uint32 *pUVar8;
  uint uVar9;
  
  lVar6 = CONCAT44(in_register_00000034,start);
  if (CDRomInit == '\x01') {
    if ((cdrom != (SDL12_CD *)0x0) || (cdrom = CDRomDevice, CDRomDevice != (SDL12_CD *)0x0)) {
      if (cdrom->status == SDL12_CD_TRAYEMPTY) {
        pcVar7 = "Tray empty";
      }
      else {
        if (-1 < start) {
          if (length < 0) {
            pcVar7 = "Invalid length";
            goto LAB_00112db0;
          }
          iVar2 = cdrom->numtracks;
          lVar3 = (long)iVar2;
          if (0 < lVar3) {
            pUVar8 = &cdrom->track[1].length;
            lVar6 = 0;
            do {
              if ((pUVar8[-2] <= (uint)start) && ((uint)start < pUVar8[-2] + pUVar8[-3])) {
                puVar1 = pUVar8 + -2;
                uVar5 = pUVar8[-3] - (start - *puVar1);
                ntracks = 0;
                uVar9 = length - uVar5;
                start_track = (uint)lVar6;
                if ((uint)length < uVar5) goto LAB_00112e20;
                if (iVar2 <= (int)(start_track + 1)) goto LAB_00112df9;
                lVar4 = -1;
                length = uVar9;
                goto LAB_00112de0;
              }
              lVar6 = lVar6 + 1;
              pUVar8 = pUVar8 + 3;
            } while (lVar6 != lVar3);
          }
        }
        pcVar7 = "Invalid start";
      }
LAB_00112db0:
      iVar2 = (*SDL20_SetError)(pcVar7,lVar6,start,SDL20_SetError);
      return iVar2;
    }
    pcVar7 = "CD-ROM not opened";
  }
  else {
    pcVar7 = "CD-ROM subsystem not initialized";
  }
  (*SDL20_SetError)(pcVar7);
  return -1;
  while( true ) {
    lVar4 = lVar4 + -1;
    pUVar8 = pUVar8 + 3;
    length = uVar9;
    if (lVar6 - lVar3 == lVar4) break;
LAB_00112de0:
    uVar9 = length - *pUVar8;
    if ((uint)length < *pUVar8) {
      ntracks = -(int)lVar4;
      goto LAB_00112e20;
    }
  }
LAB_00112df9:
  if (uVar9 == 0) {
    ntracks = -1;
    length = 0xffffffff;
  }
  else {
    ntracks = ~start_track + iVar2;
    length = cdrom->track[lVar3 + -1].length;
  }
LAB_00112e20:
  iVar2 = StartCDAudioPlaying(cdrom,start_track,start - *puVar1,ntracks,length);
  return iVar2;
}

Assistant:

SDLCALL
SDL_CDPlay(SDL12_CD *cdrom, int start, int length)
{
    const Uint32 ui32start = (Uint32) start;
    Uint32 remain = (Uint32) length;
    int start_track = -1;
    int start_frame = -1;
    int ntracks = -1;
    int nframes = -1;
    int i;

    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }
    if (cdrom->status == SDL12_CD_TRAYEMPTY) {
        return SDL20_SetError("Tray empty");
    }
    if (start < 0) {
        return SDL20_SetError("Invalid start");
    }
    if (length < 0) {
        return SDL20_SetError("Invalid length");
    }

    for (i = 0; i < cdrom->numtracks; i++) {
        if ((ui32start >= cdrom->track[i].offset) && (ui32start < (cdrom->track[i].offset + cdrom->track[i].length))) {
            start_track = i;
            break;
        }
    }

    if (start_track == -1) {
        return SDL20_SetError("Invalid start");
    }

    start_frame = start - cdrom->track[start_track].offset;

    if (remain < (cdrom->track[start_track].length - start_frame)) {
        ntracks = 0;
        nframes = remain;
        remain = 0;
    } else {
        remain -= (cdrom->track[start_track].length - start_frame);
        for (i = start_track + 1; i < cdrom->numtracks; i++) {
            if (remain < cdrom->track[i].length) {
                ntracks = i - start_track;
                nframes = remain;
                remain = 0;
                break;
            }
            remain -= cdrom->track[i].length;
        }
    }

    if (remain) {
        ntracks = (cdrom->numtracks - start_track) - 1;
        nframes = cdrom->track[cdrom->numtracks - 1].length;
    }

    return StartCDAudioPlaying(cdrom, start_track, start_frame, ntracks, nframes);
}